

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void testing::internal::JsonUnitTestResultPrinter::OutputJsonTestResult
               (ostream *stream,TestResult *result)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  TestPartResult *pTVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_RCX;
  internal *this;
  int i;
  int iVar6;
  string kIndent;
  string location;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string message;
  char local_c0 [16];
  string local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  builtin_strncpy(local_c0,"          ",0xb);
  if (0 < (int)((ulong)((long)(result->test_part_results_).
                              super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(result->test_part_results_).
                             super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x49249249) {
    iVar6 = 0;
    i = 0;
    do {
      pTVar3 = TestResult::GetTestPartResult(result,i);
      iVar2 = (int)in_RCX;
      if (pTVar3->type_ - kNonFatalFailure < 2) {
        std::__ostream_insert<char,std::char_traits<char>>(stream,",\n",2);
        if (iVar6 == 0) {
          poVar4 = std::__ostream_insert<char,std::char_traits<char>>(stream,local_c0,10);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\"",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"failures",8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\": [\n",5);
        }
        this = (internal *)(pTVar3->file_name_)._M_string_length;
        if (this != (internal *)0x0) {
          this = (internal *)(pTVar3->file_name_)._M_dataplus._M_p;
        }
        FormatCompilerIndependentFileLocation_abi_cxx11_
                  (&local_b0,this,(char *)(ulong)(uint)pTVar3->line_number_,iVar2);
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_90,local_b0._M_dataplus._M_p,
                   local_b0._M_dataplus._M_p + local_b0._M_string_length);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                  (&local_90,"\n");
        pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_90,(pTVar3->message_)._M_dataplus._M_p);
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar5->_M_dataplus)._M_p;
        in_RCX = &pbVar5->field_2;
        if (paVar1 == in_RCX) {
          local_70.field_2._M_allocated_capacity = in_RCX->_M_allocated_capacity;
          local_70.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
        }
        else {
          local_70.field_2._M_allocated_capacity = in_RCX->_M_allocated_capacity;
          local_70._M_dataplus._M_p = (pointer)paVar1;
        }
        local_70._M_string_length = pbVar5->_M_string_length;
        (pbVar5->_M_dataplus)._M_p = (pointer)in_RCX;
        pbVar5->_M_string_length = 0;
        (pbVar5->field_2)._M_local_buf[0] = '\0';
        EscapeJson(&local_50,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(stream,local_c0,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  {\n",4);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_c0,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    \"failure\": \"",0x10);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\",\n",3);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_c0,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"    \"type\": \"\"\n",0xf);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_c0,10);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"  }",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
        iVar6 = iVar6 + 1;
      }
      i = i + 1;
      iVar2 = (int)((ulong)((long)(result->test_part_results_).
                                  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(result->test_part_results_).
                                 super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 4);
    } while (SBORROW4(i,iVar2 * -0x49249249) != i + iVar2 * 0x49249249 < 0);
    if (0 < iVar6) {
      std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>(stream,local_c0,10);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]",1);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>(stream,"\n",1);
  paVar1 = &local_b0.field_2;
  local_b0.field_2._M_allocated_capacity = 0x2020202020202020;
  local_b0._M_string_length = 8;
  local_b0.field_2._M_local_buf[8] = '\0';
  local_b0._M_dataplus._M_p = (pointer)paVar1;
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>(stream,paVar1->_M_local_buf,8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar1) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static const char* GetDefaultFilter() {
  const char* const testbridge_test_only =
      internal::posix::GetEnv("TESTBRIDGE_TEST_ONLY");
  if (testbridge_test_only != nullptr) {
    return testbridge_test_only;
  }
  return kUniversalFilter;
}